

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.h
# Opt level: O0

int __thiscall
CVmImageFileStream::clone
          (CVmImageFileStream *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  int iVar1;
  undefined4 extraout_var;
  void *len;
  CVmImageFile *fpdup;
  CVmImageFileStream *in_stack_ffffffffffffffd0;
  int local_8;
  
  iVar1 = (*this->fp_->_vptr_CVmImageFile[2])(this->fp_,__fn,__child_stack,___flags);
  if (CONCAT44(extraout_var,iVar1) == 0) {
    local_8 = 0;
  }
  else {
    len = operator_new(0x18);
    CVmImageFileStream(in_stack_ffffffffffffffd0,(CVmImageFile *)this,(size_t)len);
    local_8 = (int)len;
  }
  return local_8;
}

Assistant:

CVmStream *clone(VMG_ const char *mode)
    {
        /* duplicate our file handle */
        CVmImageFile *fpdup = fp_->dup(mode);
        if (fpdup == 0)
            return 0;

        /* create a new image file stream wrapper for the duplicate handle */
        return new CVmImageFileStream(fpdup, len_);
    }